

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

string * __thiscall
t_cpp_generator::namespace_close(string *__return_storage_ptr__,t_cpp_generator *this,string *ns)

{
  long lVar1;
  string local_60 [32];
  long local_40;
  size_type loc;
  allocator local_21;
  string *local_20;
  string *ns_local;
  t_cpp_generator *this_local;
  string *result;
  
  local_20 = ns;
  ns_local = (string *)this;
  this_local = (t_cpp_generator *)__return_storage_ptr__;
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    loc._3_1_ = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"}",(allocator *)((long)&loc + 2))
    ;
    std::allocator<char>::~allocator((allocator<char> *)((long)&loc + 2));
    while (local_40 = std::__cxx11::string::find((char *)ns,0x4e5538), local_40 != -1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"}");
      std::__cxx11::string::substr((ulong)local_60,(ulong)ns);
      std::__cxx11::string::operator=((string *)ns,local_60);
      std::__cxx11::string::~string(local_60);
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," // namespace");
  }
  return __return_storage_ptr__;
}

Assistant:

string t_cpp_generator::namespace_close(string ns) {
  if (ns.size() == 0) {
    return "";
  }
  string result = "}";
  string::size_type loc;
  while ((loc = ns.find(".")) != string::npos) {
    result += "}";
    ns = ns.substr(loc + 1);
  }
  result += " // namespace";
  return result;
}